

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_353d22::cURLProgressHelper::UpdatePercentage
          (cURLProgressHelper *this,double value,double total,string *status)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  bool bVar4;
  string local_1e0 [48];
  ostringstream local_1b0 [8];
  ostringstream oss;
  bool updated;
  long OldPercentage;
  string *status_local;
  double total_local;
  double value_local;
  cURLProgressHelper *this_local;
  
  lVar1 = this->CurrentPercentage;
  if (0.0 < total) {
    lVar2 = lround((value / total) * 100.0);
    this->CurrentPercentage = lVar2;
    if (100 < this->CurrentPercentage) {
      this->CurrentPercentage = 100;
    }
  }
  bVar4 = lVar1 != this->CurrentPercentage;
  if (bVar4) {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar3 = std::operator<<((ostream *)local_1b0,"[");
    poVar3 = std::operator<<(poVar3,(string *)&this->Text);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->CurrentPercentage);
    std::operator<<(poVar3,"% complete]");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)status,local_1e0);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::ostringstream::~ostringstream(local_1b0);
  }
  return bVar4;
}

Assistant:

bool UpdatePercentage(double value, double total, std::string& status)
  {
    long OldPercentage = this->CurrentPercentage;

    if (total > 0.0) {
      this->CurrentPercentage = std::lround(value / total * 100.0);
      if (this->CurrentPercentage > 100) {
        // Avoid extra progress reports for unexpected data beyond total.
        this->CurrentPercentage = 100;
      }
    }

    bool updated = (OldPercentage != this->CurrentPercentage);

    if (updated) {
      std::ostringstream oss;
      oss << "[" << this->Text << " " << this->CurrentPercentage
          << "% complete]";
      status = oss.str();
    }

    return updated;
  }